

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O1

IfStatement * __thiscall
soul::PoolAllocator::
allocate<soul::AST::IfStatement,soul::AST::Context&,bool&,soul::AST::Expression&,soul::AST::Block&,soul::pool_ptr<soul::AST::Statement>&>
          (PoolAllocator *this,Context *args,bool *args_1,Expression *args_2,Block *args_3,
          pool_ptr<soul::AST::Statement> *args_4)

{
  bool bVar1;
  Statement *pSVar2;
  SourceCodeText *pSVar3;
  PoolItem *pPVar4;
  
  pPVar4 = allocateSpaceForObject(this,0x48);
  bVar1 = *args_1;
  pSVar2 = args_4->object;
  pPVar4->item = &PTR__ASTObject_00301658;
  *(undefined4 *)&pPVar4->field_0x18 = 0xc;
  pSVar3 = (args->location).sourceCode.object;
  pPVar4[1].size = (size_t)pSVar3;
  if (pSVar3 != (SourceCodeText *)0x0) {
    (pSVar3->super_RefCountedObject).refCount = (pSVar3->super_RefCountedObject).refCount + 1;
  }
  pPVar4[1].destructor = (DestructorFn *)(args->location).location.data;
  pPVar4[1].item = args->parentScope;
  pPVar4->item = &PTR__IfStatement_00303060;
  *(Expression **)&pPVar4[1].field_0x18 = args_2;
  pPVar4[2].size = (size_t)args_3;
  pPVar4[2].destructor = (DestructorFn *)pSVar2;
  *(bool *)&pPVar4[2].item = bVar1;
  pPVar4->destructor =
       allocate<soul::AST::IfStatement,_soul::AST::Context_&,_bool_&,_soul::AST::Expression_&,_soul::AST::Block_&,_soul::pool_ptr<soul::AST::Statement>_&>
       ::anon_class_1_0_00000001::__invoke;
  return (IfStatement *)&pPVar4->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }